

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_SimdShuffleV8X16<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  SIMDValue SVar9;
  SIMDValue src2;
  uint32 local_78 [2];
  uint32 lanes [16];
  
  lanes._56_8_ = this;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar8 = 0;
  do {
    uVar2 = lanes._56_8_;
    if (lVar8 == 0x10) {
      bVar4 = playout->R0;
      lVar8 = *(long *)(lanes._56_8_ + 0x148);
      lVar6 = (ulong)playout->R1 * 0x10;
      lVar7 = (ulong)playout->R2 * 0x10;
      SVar9.field_0.f64[1] = (Type)*(undefined8 *)(lVar8 + 8 + lVar6);
      SVar9.field_0.f64[0] = (Type)*(undefined8 *)(lVar8 + lVar6);
      src2.field_0.f64[1] = (Type)*(undefined8 *)(lVar8 + 8 + lVar7);
      src2.field_0.f64[0] = (Type)*(undefined8 *)(lVar8 + lVar7);
      SVar9 = SIMDUtils::SIMD128InnerShuffle(SVar9,src2,0x10,local_78);
      lVar8 = *(long *)(uVar2 + 0x148);
      lVar6 = (ulong)bVar4 * 0x10;
      *(long *)(lVar8 + lVar6) = SVar9.field_0._0_8_;
      *(long *)(lVar8 + 8 + lVar6) = SVar9.field_0._8_8_;
      return;
    }
    bVar4 = playout->INDICES[lVar8];
    if (0x1f < bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x20d5,"(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2)",
                                  "playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      bVar4 = playout->INDICES[lVar8];
    }
    local_78[lVar8] = (uint)bVar4;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void InterpreterStackFrame::OP_SimdShuffleV8X16(const unaligned T* playout)
    {
        uint32 lanes[Wasm::Simd::MAX_LANES];
        for (uint32 i = 0; i < Wasm::Simd::MAX_LANES; i++)
        {
            Assert(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2);
            lanes[i] = playout->INDICES[i];
        }
        SetRegRawSimd(playout->R0, SIMDUtils::SIMD128InnerShuffle(GetRegRawSimd(playout->R1), GetRegRawSimd(playout->R2), Wasm::Simd::MAX_LANES, lanes));
    }